

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O3

void __thiscall
RasterizerA3<16u>::_renderImpl<CompositorScalar,true>(RasterizerA3<16u> *this,uint32_t argb32)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  undefined1 in_XMM0 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong *local_80;
  long local_78;
  long local_68;
  
  auVar4 = _DAT_001144d0;
  uVar20 = (ulong)(int)*(uint *)(this + 0x40);
  uVar2 = *(uint *)(this + 0x44);
  if (*(uint *)(this + 0x40) <= uVar2) {
    lVar3 = *(long *)(*(long *)(this + 8) + 8);
    iVar18 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar8 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar22 = (iVar8 + 0x800080U >> 8 & 0xff00ff) + iVar8 + 0x800080;
    uVar12 = (iVar18 + 0x800080U >> 8 & 0xff00ff) + iVar18 + 0x800080 >> 8 & 0xff00ff;
    uVar17 = uVar22 & 0xff00ff00 | uVar12;
    lVar11 = *(long *)(*(long *)(this + 8) + 0x10);
    lVar24 = lVar11 + lVar3 * uVar20;
    lVar25 = *(long *)(this + 0x58) * uVar20 * 8 + *(long *)(this + 0x60);
    local_80 = (ulong *)(*(long *)(this + 0x48) * uVar20 * 8 + *(long *)(this + 0x50));
    uVar22 = uVar22 >> 8 & 0xff00ff;
    local_78 = lVar11 + lVar3 * uVar20 + 0xc;
    auVar26 = pmovsxbq(in_XMM0,0x302);
    auVar27 = pmovsxbq(in_XMM1,0x100);
    do {
      lVar11 = *(long *)(this + 0x48);
      local_68 = 3;
      uVar19 = 0;
      uVar15 = 0;
      uVar7 = 0;
      do {
        uVar10 = *local_80;
        *local_80 = 0;
        uVar1 = uVar7 + 0x400;
        while (uVar10 != 0) {
          lVar21 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar23 = -1L << ((byte)lVar21 & 0x3f);
          uVar9 = (ulong)(uint)((int)lVar21 << 4);
          uVar5 = uVar9 | uVar7;
          uVar6 = uVar15;
          if (uVar15 < uVar5) {
            uVar13 = -uVar19;
            if (0 < (int)uVar19) {
              uVar13 = uVar19;
            }
            if (0xfe < uVar13) {
              uVar13 = 0xff;
            }
            uVar6 = uVar5;
            if (uVar13 != 0) {
              if (uVar13 == 0xff) {
                lVar21 = ~uVar15 + (uVar9 | uVar7);
                auVar30._8_4_ = (int)lVar21;
                auVar30._0_8_ = lVar21;
                auVar30._12_4_ = (int)((ulong)lVar21 >> 0x20);
                lVar21 = local_78 + uVar15 * 4;
                uVar5 = 0;
                do {
                  auVar28._8_4_ = (int)uVar5;
                  auVar28._0_8_ = uVar5;
                  auVar28._12_4_ = (int)(uVar5 >> 0x20);
                  auVar29 = auVar30 ^ auVar4;
                  auVar31 = (auVar28 | auVar27) ^ auVar4;
                  iVar8 = auVar29._4_4_;
                  if ((bool)(~(iVar8 < auVar31._4_4_ ||
                              auVar29._0_4_ < auVar31._0_4_ && auVar31._4_4_ == iVar8) & 1)) {
                    *(uint *)(lVar21 + -0xc + uVar5 * 4) = uVar17;
                  }
                  if (auVar31._12_4_ <= auVar29._12_4_ &&
                      (auVar31._8_4_ <= auVar29._8_4_ || auVar31._12_4_ != auVar29._12_4_)) {
                    *(uint *)(lVar21 + -8 + uVar5 * 4) = uVar17;
                  }
                  auVar28 = (auVar28 | auVar26) ^ auVar4;
                  iVar18 = auVar28._4_4_;
                  if (iVar18 <= iVar8 && (iVar18 != iVar8 || auVar28._0_4_ <= auVar29._0_4_)) {
                    *(uint *)(lVar21 + -4 + uVar5 * 4) = uVar17;
                    *(uint *)(lVar21 + uVar5 * 4) = uVar17;
                  }
                  uVar5 = uVar5 + 4;
                } while (((local_68 + uVar9) - uVar15 & 0xfffffffffffffffc) != uVar5);
              }
              else {
                do {
                  uVar14 = *(uint *)(lVar24 + uVar15 * 4);
                  uVar16 = (uVar14 & 0xff00ff) * (uVar13 ^ 0xff) + uVar13 * uVar12 + 0x800080;
                  uVar14 = (uVar14 >> 8 & 0xff00ff) * (uVar13 ^ 0xff) + uVar13 * uVar22 + 0x800080;
                  *(uint *)(lVar24 + uVar15 * 4) =
                       (uVar16 >> 8 & 0xff00ff) + uVar16 >> 8 & 0xff00ff |
                       (uVar14 >> 8 & 0xff00ff) + uVar14 & 0xff00ff00;
                  uVar15 = uVar15 + 1;
                } while (uVar15 < uVar5);
              }
            }
          }
          if (uVar10 == uVar23) {
            uVar15 = (long)*(int *)(this + 0x30);
            if (uVar1 < (ulong)(long)*(int *)(this + 0x30)) {
              uVar15 = uVar1;
            }
            uVar10 = 0;
          }
          else {
            uVar23 = uVar23 ^ uVar10;
            lVar21 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar10 = -1L << ((byte)lVar21 & 0x3f) ^ uVar23;
            uVar15 = (uint)((int)lVar21 << 4) | uVar7;
          }
          if (uVar6 < uVar15) {
            do {
              uVar19 = uVar19 + *(int *)(lVar25 + uVar6 * 8);
              uVar14 = uVar19 - (*(int *)(lVar25 + 4 + uVar6 * 8) >> 9);
              uVar13 = -uVar14;
              if (0 < (int)uVar14) {
                uVar13 = uVar14;
              }
              *(undefined8 *)(lVar25 + uVar6 * 8) = 0;
              uVar14 = uVar17;
              if (uVar13 < 0xff) {
                uVar14 = *(uint *)(lVar24 + uVar6 * 4);
                iVar18 = uVar13 * uVar12 + (uVar14 & 0xff00ff) * (0xff - uVar13);
                iVar8 = uVar13 * uVar22 + (0xff - uVar13) * (uVar14 >> 8 & 0xff00ff);
                uVar14 = (iVar18 + 0x800080U >> 8 & 0xff00ff) + iVar18 + 0x800080 >> 8 & 0xff00ff |
                         iVar8 + (iVar8 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
              }
              *(uint *)(lVar24 + uVar6 * 4) = uVar14;
              uVar6 = uVar6 + 1;
            } while (uVar15 != uVar6);
          }
        }
        local_80 = local_80 + 1;
        local_68 = local_68 + 0x400;
        lVar11 = lVar11 + -1;
        uVar7 = uVar1;
      } while (lVar11 != 0);
      uVar7 = (ulong)*(int *)(this + 0x30);
      lVar11 = uVar7 - uVar15;
      if (uVar15 <= uVar7 && lVar11 != 0) {
        uVar13 = -uVar19;
        if (0 < (int)uVar19) {
          uVar13 = uVar19;
        }
        if (0xfe < uVar13) {
          uVar13 = 0xff;
        }
        if (uVar13 != 0) {
          if (uVar13 == 0xff) {
            lVar21 = lVar11 + -1;
            auVar29._8_4_ = (int)lVar21;
            auVar29._0_8_ = lVar21;
            auVar29._12_4_ = (int)((ulong)lVar21 >> 0x20);
            lVar21 = local_78 + uVar15 * 4;
            auVar29 = auVar29 ^ auVar4;
            uVar15 = 0;
            do {
              auVar31._8_4_ = (int)uVar15;
              auVar31._0_8_ = uVar15;
              auVar31._12_4_ = (int)(uVar15 >> 0x20);
              auVar30 = (auVar31 | auVar27) ^ auVar4;
              iVar8 = auVar29._4_4_;
              if ((bool)(~(iVar8 < auVar30._4_4_ ||
                          auVar29._0_4_ < auVar30._0_4_ && auVar30._4_4_ == iVar8) & 1)) {
                *(uint *)(lVar21 + -0xc + uVar15 * 4) = uVar17;
              }
              if (auVar30._12_4_ <= auVar29._12_4_ &&
                  (auVar30._8_4_ <= auVar29._8_4_ || auVar30._12_4_ != auVar29._12_4_)) {
                *(uint *)(lVar21 + -8 + uVar15 * 4) = uVar17;
              }
              auVar30 = (auVar31 | auVar26) ^ auVar4;
              iVar18 = auVar30._4_4_;
              if (iVar18 <= iVar8 && (iVar18 != iVar8 || auVar30._0_4_ <= auVar29._0_4_)) {
                *(uint *)(lVar21 + -4 + uVar15 * 4) = uVar17;
                *(uint *)(lVar21 + uVar15 * 4) = uVar17;
              }
              uVar15 = uVar15 + 4;
            } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar15);
          }
          else {
            do {
              uVar19 = *(uint *)(lVar24 + uVar15 * 4);
              uVar14 = (uVar19 & 0xff00ff) * (uVar13 ^ 0xff) + uVar13 * uVar12 + 0x800080;
              uVar19 = (uVar19 >> 8 & 0xff00ff) * (uVar13 ^ 0xff) + uVar13 * uVar22 + 0x800080;
              *(uint *)(lVar24 + uVar15 * 4) =
                   (uVar14 >> 8 & 0xff00ff) + uVar14 >> 8 & 0xff00ff |
                   (uVar19 >> 8 & 0xff00ff) + uVar19 & 0xff00ff00;
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
          }
        }
      }
      lVar24 = lVar24 + lVar3;
      lVar25 = lVar25 + *(long *)(this + 0x58) * 8;
      uVar20 = uVar20 + 1;
      local_78 = local_78 + lVar3;
    } while (uVar20 <= (ulong)(long)(int)uVar2);
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}